

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.h
# Opt level: O0

Float pbrt::SqrtRoundUp(Float a)

{
  uint in_XMM0_Da;
  float fVar1;
  float unaff_retaddr;
  
  std::sqrt((double)(ulong)in_XMM0_Da);
  fVar1 = NextFloatUp(unaff_retaddr);
  return fVar1;
}

Assistant:

inline PBRT_CPU_GPU Float SqrtRoundUp(Float a) {
#ifdef PBRT_IS_GPU_CODE
#ifdef PBRT_FLOAT_AS_DOUBLE
    return __dsqrt_ru(a);
#else
    return __fsqrt_ru(a);
#endif
#else  // CPU
    return NextFloatUp(std::sqrt(a));
#endif
}